

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O3

void mg_set_handler_type(mg_context *phys_ctx,mg_domain_context *dom_ctx,char *uri,int handler_type,
                        int is_delete_request,mg_request_handler handler,
                        mg_websocket_subprotocols *subprotocols,
                        mg_websocket_connect_handler connect_handler,
                        mg_websocket_ready_handler ready_handler,
                        mg_websocket_data_handler data_handler,
                        mg_websocket_close_handler close_handler,
                        mg_authorization_handler auth_handler,void *cbdata)

{
  mg_handler_info **ppmVar1;
  pthread_mutex_t *__mutex;
  int iVar2;
  size_t sVar3;
  mg_handler_info **ppmVar4;
  mg_handler_info *pmVar5;
  size_t len;
  char *pcVar6;
  long lVar7;
  uint uVar8;
  ulong uVar9;
  undefined7 uVar11;
  pthread_mutex_t *ppVar10;
  char *extraout_RDX;
  mg_context *ctx;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  mg_handler_info **ppmVar12;
  bool bVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  int local_70;
  int iStack_6c;
  int local_68;
  int iStack_64;
  
  uVar9 = (ulong)(uint)handler_type;
  sVar3 = strlen(uri);
  iStack_64 = (int)((ulong)close_handler >> 0x20);
  local_70 = (int)data_handler;
  iStack_6c = (int)((ulong)data_handler >> 0x20);
  local_68 = (int)close_handler;
  if (handler_type == 1) {
    if (handler != (mg_request_handler)0x0) {
      return;
    }
    auVar14._0_4_ = -(uint)((int)connect_handler == 0 && local_70 == 0);
    auVar14._4_4_ = -(uint)(connect_handler._4_4_ == 0 && iStack_6c == 0);
    auVar14._8_4_ = -(uint)(local_70 == 0 && local_68 == 0);
    auVar14._12_4_ = -(uint)(iStack_6c == 0 && iStack_64 == 0);
    uVar8 = movmskps((int)uVar9,auVar14);
    uVar9 = (ulong)(uVar8 ^ 0xf);
    bVar13 = (uVar8 ^ 0xf) == 0;
LAB_001125af:
    uVar11 = (undefined7)(uVar9 >> 8);
    if (bVar13 && is_delete_request == 0 || auth_handler != (mg_authorization_handler)0x0) {
      return;
    }
  }
  else {
    if (handler_type != 2) {
      if (handler_type != 0) {
        return;
      }
      auVar15._0_4_ = -(uint)((int)connect_handler == 0 && local_70 == 0);
      auVar15._4_4_ = -(uint)(connect_handler._4_4_ == 0 && iStack_6c == 0);
      auVar15._8_4_ = -(uint)(local_70 == 0 && local_68 == 0);
      auVar15._12_4_ = -(uint)(iStack_6c == 0 && iStack_64 == 0);
      iVar2 = movmskps((int)sVar3,auVar15);
      if (iVar2 != 0xf) {
        return;
      }
      bVar13 = handler == (mg_request_handler)0x0;
      goto LAB_001125af;
    }
    if (handler != (mg_request_handler)0x0) {
      return;
    }
    auVar16._0_4_ = -(uint)((int)connect_handler == 0 && local_70 == 0);
    auVar16._4_4_ = -(uint)(connect_handler._4_4_ == 0 && iStack_6c == 0);
    auVar16._8_4_ = -(uint)(local_70 == 0 && local_68 == 0);
    auVar16._12_4_ = -(uint)(iStack_6c == 0 && iStack_64 == 0);
    iVar2 = movmskps((int)sVar3,auVar16);
    if (iVar2 != 0xf) {
      return;
    }
    uVar11 = (undefined7)(uVar9 >> 8);
    if (is_delete_request == 0 && auth_handler == (mg_authorization_handler)0x0) {
      return;
    }
  }
  uVar8 = (uint)CONCAT71(uVar11,dom_ctx == (mg_domain_context *)0x0 || phys_ctx == (mg_context *)0x0
                        );
  if (dom_ctx != (mg_domain_context *)0x0 && phys_ctx != (mg_context *)0x0) {
    if (phys_ctx->context_type == 1) {
      pthread_mutex_lock((pthread_mutex_t *)&phys_ctx->nonce_mutex);
    }
    ppmVar4 = &dom_ctx->handlers;
    ppmVar12 = ppmVar4;
    if (dom_ctx->handlers != (mg_handler_info *)0x0) {
      __mutex = &phys_ctx->nonce_mutex;
      ppVar10 = __mutex;
      pmVar5 = dom_ctx->handlers;
LAB_0011262d:
      do {
        if (((pmVar5->handler_type == handler_type) && (sVar3 == pmVar5->uri_len)) &&
           (iVar2 = strcmp(pmVar5->uri,uri), iVar2 == 0)) {
          if (is_delete_request == 0) {
            if (handler_type == 0) {
              if (pmVar5->refcount != 0) {
                if (phys_ctx->context_type == 1) {
                  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
                }
                usleep(1000);
                iVar2 = phys_ctx->context_type;
                goto joined_r0x00112710;
              }
              lVar7 = 0x18;
            }
            else {
              lVar7 = 0x50;
              handler = auth_handler;
              if (handler_type == 1) {
                pmVar5->subprotocols = subprotocols;
                pmVar5->connect_handler = connect_handler;
                pmVar5->ready_handler = ready_handler;
                pmVar5->data_handler = data_handler;
                lVar7 = 0x40;
                handler = (mg_request_handler)close_handler;
              }
            }
            *(mg_request_handler *)((long)&pmVar5->uri + lVar7) = handler;
            pmVar5->cbdata = cbdata;
          }
          else {
            if ((handler_type == 0) && (pmVar5->refcount != 0)) {
              pmVar5->removing = 1;
              if (phys_ctx->context_type == 1) {
                pthread_mutex_unlock((pthread_mutex_t *)__mutex);
              }
              usleep(1000);
              iVar2 = phys_ctx->context_type;
joined_r0x00112710:
              if (iVar2 == 1) {
                pthread_mutex_lock((pthread_mutex_t *)__mutex);
              }
              uVar8 = (uint)ppVar10;
              pmVar5 = *ppmVar4;
              ppmVar12 = ppmVar4;
              if (pmVar5 == (mg_handler_info *)0x0) break;
              goto LAB_0011262d;
            }
            *ppmVar12 = pmVar5->next;
            free(pmVar5->uri);
            free(pmVar5);
          }
          if (phys_ctx->context_type != 1) {
            return;
          }
          goto LAB_00112791;
        }
        uVar8 = (uint)ppVar10;
        ppmVar1 = &pmVar5->next;
        ppmVar12 = &pmVar5->next;
        pmVar5 = *ppmVar1;
      } while (*ppmVar1 != (mg_handler_info *)0x0);
    }
    if (is_delete_request == 0) {
      pmVar5 = (mg_handler_info *)calloc(1,0x68);
      if (pmVar5 == (mg_handler_info *)0x0) {
        pcVar6 = extraout_RDX;
        if (phys_ctx->context_type == 1) {
          pthread_mutex_unlock((pthread_mutex_t *)&phys_ctx->nonce_mutex);
          pcVar6 = extraout_RDX_00;
        }
LAB_00112893:
        mg_cry_internal_wrap
                  ((mg_connection *)0x0,phys_ctx,pcVar6,uVar8,"%s",
                   "Cannot create new request handler struct, OOM");
        return;
      }
      len = strlen(uri);
      pcVar6 = mg_strndup_ctx(uri,len,ctx);
      pmVar5->uri = pcVar6;
      if (pcVar6 == (char *)0x0) {
        if (phys_ctx->context_type == 1) {
          pthread_mutex_unlock((pthread_mutex_t *)&phys_ctx->nonce_mutex);
        }
        free(pmVar5);
        pcVar6 = extraout_RDX_01;
        goto LAB_00112893;
      }
      pmVar5->uri_len = sVar3;
      if (handler_type == 0) {
        pmVar5->removing = 0;
        lVar7 = 0x18;
        auth_handler = handler;
      }
      else {
        lVar7 = 0x50;
        if (handler_type == 1) {
          pmVar5->subprotocols = subprotocols;
          pmVar5->connect_handler = connect_handler;
          pmVar5->ready_handler = ready_handler;
          pmVar5->data_handler = data_handler;
          lVar7 = 0x40;
          auth_handler = (mg_authorization_handler)close_handler;
        }
      }
      *(mg_authorization_handler *)((long)&pmVar5->uri + lVar7) = auth_handler;
      pmVar5->cbdata = cbdata;
      pmVar5->handler_type = handler_type;
      *ppmVar12 = pmVar5;
    }
    if (phys_ctx->context_type == 1) {
LAB_00112791:
      pthread_mutex_unlock((pthread_mutex_t *)&phys_ctx->nonce_mutex);
      return;
    }
  }
  return;
}

Assistant:

static void
mg_set_handler_type(struct mg_context *phys_ctx,
                    struct mg_domain_context *dom_ctx,
                    const char *uri,
                    int handler_type,
                    int is_delete_request,
                    mg_request_handler handler,
                    struct mg_websocket_subprotocols *subprotocols,
                    mg_websocket_connect_handler connect_handler,
                    mg_websocket_ready_handler ready_handler,
                    mg_websocket_data_handler data_handler,
                    mg_websocket_close_handler close_handler,
                    mg_authorization_handler auth_handler,
                    void *cbdata)
{
	struct mg_handler_info *tmp_rh, **lastref;
	size_t urilen = strlen(uri);

	if (handler_type == WEBSOCKET_HANDLER) {
		DEBUG_ASSERT(handler == NULL);
		DEBUG_ASSERT(is_delete_request || connect_handler != NULL
		             || ready_handler != NULL || data_handler != NULL
		             || close_handler != NULL);

		DEBUG_ASSERT(auth_handler == NULL);
		if (handler != NULL) {
			return;
		}
		if (!is_delete_request && (connect_handler == NULL)
		    && (ready_handler == NULL) && (data_handler == NULL)
		    && (close_handler == NULL)) {
			return;
		}
		if (auth_handler != NULL) {
			return;
		}

	} else if (handler_type == REQUEST_HANDLER) {
		DEBUG_ASSERT(connect_handler == NULL && ready_handler == NULL
		             && data_handler == NULL && close_handler == NULL);
		DEBUG_ASSERT(is_delete_request || (handler != NULL));
		DEBUG_ASSERT(auth_handler == NULL);

		if ((connect_handler != NULL) || (ready_handler != NULL)
		    || (data_handler != NULL) || (close_handler != NULL)) {
			return;
		}
		if (!is_delete_request && (handler == NULL)) {
			return;
		}
		if (auth_handler != NULL) {
			return;
		}

	} else if (handler_type == AUTH_HANDLER) {
		DEBUG_ASSERT(handler == NULL);
		DEBUG_ASSERT(connect_handler == NULL && ready_handler == NULL
		             && data_handler == NULL && close_handler == NULL);
		DEBUG_ASSERT(is_delete_request || (auth_handler != NULL));
		if (handler != NULL) {
			return;
		}
		if ((connect_handler != NULL) || (ready_handler != NULL)
		    || (data_handler != NULL) || (close_handler != NULL)) {
			return;
		}
		if (!is_delete_request && (auth_handler == NULL)) {
			return;
		}
	} else {
		/* Unknown handler type. */
		return;
	}

	if (!phys_ctx || !dom_ctx) {
		/* no context available */
		return;
	}

	mg_lock_context(phys_ctx);

	/* first try to find an existing handler */
	do {
		lastref = &(dom_ctx->handlers);
		for (tmp_rh = dom_ctx->handlers; tmp_rh != NULL;
		     tmp_rh = tmp_rh->next) {
			if (tmp_rh->handler_type == handler_type
			    && (urilen == tmp_rh->uri_len) && !strcmp(tmp_rh->uri, uri)) {
				if (!is_delete_request) {
					/* update existing handler */
					if (handler_type == REQUEST_HANDLER) {
						/* Wait for end of use before updating */
						if (tmp_rh->refcount) {
							mg_unlock_context(phys_ctx);
							mg_sleep(1);
							mg_lock_context(phys_ctx);
							/* tmp_rh might have been freed, search again. */
							break;
						}
						/* Ok, the handler is no more use -> Update it */
						tmp_rh->handler = handler;
					} else if (handler_type == WEBSOCKET_HANDLER) {
						tmp_rh->subprotocols = subprotocols;
						tmp_rh->connect_handler = connect_handler;
						tmp_rh->ready_handler = ready_handler;
						tmp_rh->data_handler = data_handler;
						tmp_rh->close_handler = close_handler;
					} else { /* AUTH_HANDLER */
						tmp_rh->auth_handler = auth_handler;
					}
					tmp_rh->cbdata = cbdata;
				} else {
					/* remove existing handler */
					if (handler_type == REQUEST_HANDLER) {
						/* Wait for end of use before removing */
						if (tmp_rh->refcount) {
							tmp_rh->removing = 1;
							mg_unlock_context(phys_ctx);
							mg_sleep(1);
							mg_lock_context(phys_ctx);
							/* tmp_rh might have been freed, search again. */
							break;
						}
						/* Ok, the handler is no more used */
					}
					*lastref = tmp_rh->next;
					mg_free(tmp_rh->uri);
					mg_free(tmp_rh);
				}
				mg_unlock_context(phys_ctx);
				return;
			}
			lastref = &(tmp_rh->next);
		}
	} while (tmp_rh != NULL);

	if (is_delete_request) {
		/* no handler to set, this was a remove request to a non-existing
		 * handler */
		mg_unlock_context(phys_ctx);
		return;
	}

	tmp_rh =
	    (struct mg_handler_info *)mg_calloc_ctx(1,
	                                            sizeof(struct mg_handler_info),
	                                            phys_ctx);
	if (tmp_rh == NULL) {
		mg_unlock_context(phys_ctx);
		mg_cry_ctx_internal(phys_ctx,
		                    "%s",
		                    "Cannot create new request handler struct, OOM");
		return;
	}
	tmp_rh->uri = mg_strdup_ctx(uri, phys_ctx);
	if (!tmp_rh->uri) {
		mg_unlock_context(phys_ctx);
		mg_free(tmp_rh);
		mg_cry_ctx_internal(phys_ctx,
		                    "%s",
		                    "Cannot create new request handler struct, OOM");
		return;
	}
	tmp_rh->uri_len = urilen;
	if (handler_type == REQUEST_HANDLER) {
		tmp_rh->refcount = 0;
		tmp_rh->removing = 0;
		tmp_rh->handler = handler;
	} else if (handler_type == WEBSOCKET_HANDLER) {
		tmp_rh->subprotocols = subprotocols;
		tmp_rh->connect_handler = connect_handler;
		tmp_rh->ready_handler = ready_handler;
		tmp_rh->data_handler = data_handler;
		tmp_rh->close_handler = close_handler;
	} else { /* AUTH_HANDLER */
		tmp_rh->auth_handler = auth_handler;
	}
	tmp_rh->cbdata = cbdata;
	tmp_rh->handler_type = handler_type;
	tmp_rh->next = NULL;

	*lastref = tmp_rh;
	mg_unlock_context(phys_ctx);
}